

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

size_t __thiscall Lodtalk::MethodAssembler::Assembler::computeInstructionsSize(Assembler *this)

{
  InstructionNode *pIVar1;
  int iVar2;
  InstructionNode **instr_2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppIVar3;
  pointer ppIVar4;
  size_t sVar5;
  InstructionNode **instr_1;
  pointer ppIVar6;
  ulong uVar7;
  InstructionNode **instr;
  bool bVar8;
  
  ppIVar4 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  sVar5 = 0;
  for (ppIVar6 = (this->instructionStream).
                 super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar6 != ppIVar4;
      ppIVar6 = ppIVar6 + 1) {
    pIVar1 = *ppIVar6;
    pIVar1->position = sVar5;
    iVar2 = (*pIVar1->_vptr_InstructionNode[4])(pIVar1);
    pIVar1->size = CONCAT44(extraout_var,iVar2);
    sVar5 = sVar5 + CONCAT44(extraout_var,iVar2);
    pIVar1 = *ppIVar6;
    pIVar1->lastPosition = pIVar1->position;
    pIVar1->lastSize = pIVar1->size;
  }
  ppIVar6 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar4 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    uVar7 = 0;
    for (; ppIVar6 != ppIVar4; ppIVar6 = ppIVar6 + 1) {
      pIVar1 = *ppIVar6;
      pIVar1->position = uVar7;
      iVar2 = (*pIVar1->_vptr_InstructionNode[5])(pIVar1);
      pIVar1->size = CONCAT44(extraout_var_00,iVar2);
      uVar7 = uVar7 + CONCAT44(extraout_var_00,iVar2);
    }
    ppIVar4 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar6 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (ppIVar3 = ppIVar6; ppIVar3 != ppIVar4; ppIVar3 = ppIVar3 + 1) {
      pIVar1 = *ppIVar3;
      pIVar1->lastPosition = pIVar1->position;
      pIVar1->lastSize = pIVar1->size;
    }
    bVar8 = uVar7 < sVar5;
    sVar5 = uVar7;
  } while (bVar8);
  return uVar7;
}

Assistant:

size_t Assembler::computeInstructionsSize()
{
	// Compute the max size.
	size_t maxSize = 0;
	for(auto &instr : instructionStream)
    {
		maxSize += instr->computeMaxSizeForPosition(maxSize);
        instr->commitSize();
    }

	// Compute the optimal iteratively.
	size_t oldSize = maxSize;
	size_t currentSize = maxSize;
	do
	{
		oldSize = currentSize;
		currentSize = 0;
		for(auto &instr : instructionStream)
			currentSize += instr->computeBetterSizeForPosition(currentSize);
        for(auto &instr : instructionStream)
            instr->commitSize();
	} while(currentSize < oldSize);

	return currentSize;
}